

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  ImWchar *__dest;
  float fVar1;
  uchar uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  int iVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  unsigned_short *puVar8;
  float fVar9;
  StbUndoRecord *pSVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  short sVar15;
  uint uVar16;
  long lVar17;
  int *piVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  float fVar27;
  StbTexteditRow row;
  ImWchar ch;
  undefined2 uStack_46;
  uint local_3c;
  int local_38;
  uint local_34;
  
  state = &this->Stb;
  uVar2 = (this->Stb).single_line;
  iVar12 = 1;
LAB_00159229:
  switch(key) {
  case 0x200000:
    goto switchD_0015923b_caseD_200000;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      state->cursor = state->cursor + 1;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    ImStb::stb_textedit_clamp(this,state);
    goto LAB_00159c95;
  case 0x200002:
  case 0x20000e:
switchD_0015923b_caseD_200002:
    uVar25 = key & 0x400000;
    if ((key & 0xffbfffffU) == 0x20000e) {
      iVar12 = (this->Stb).row_count_per_page;
    }
    else if (uVar2 != '\0') {
      key = uVar25 | 0x200000;
      goto LAB_00159229;
    }
    if (uVar25 == 0) {
      if ((this->Stb).select_start != (this->Stb).select_end) {
        ImStb::stb_textedit_move_to_first(state);
      }
    }
    else {
      ImStb::stb_textedit_prep_selection_at_cursor(state);
    }
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_find_charpos
              ((StbFindState *)&ch,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    iVar20 = 0;
    goto LAB_00159337;
  case 0x200003:
  case 0x20000f:
switchD_0015923b_caseD_200003:
    uVar25 = key & 0x400000;
    if ((key & 0xffbfffffU) == 0x20000f) {
      iVar12 = (this->Stb).row_count_per_page;
LAB_001592c1:
      if (uVar25 == 0) {
        if ((this->Stb).select_start != (this->Stb).select_end) {
          ImStb::stb_textedit_move_to_last(this,state);
        }
      }
      else {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_find_charpos
                ((StbFindState *)&ch,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
      iVar20 = 0;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      goto LAB_0015949d;
    }
    if (uVar2 == '\0') goto LAB_001592c1;
    key = uVar25 | 0x200001;
    goto LAB_00159229;
  case 0x200004:
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar12 = (this->Stb).cursor;
      puVar8 = (this->TextW).Data;
      while ((0 < iVar12 && (puVar8[iVar12 - 1] != 10))) {
        iVar12 = iVar12 + -1;
        state->cursor = iVar12;
      }
    }
    else {
      state->cursor = 0;
    }
    goto LAB_00159c95;
  case 0x200005:
    iVar12 = this->CurLenW;
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar20 = (this->Stb).cursor;
      puVar8 = (this->TextW).Data;
      for (lVar17 = (long)iVar20; (iVar20 = iVar20 + 1, lVar17 < iVar12 && (puVar8[lVar17] != 10));
          lVar17 = lVar17 + 1) {
        state->cursor = iVar20;
      }
    }
    else {
      state->cursor = iVar12;
    }
    goto LAB_00159c95;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_00159c95;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_00159c95;
  case 0x200008:
switchD_0015923b_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar12 = (this->Stb).cursor;
      if (iVar12 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar12,1);
      }
      goto LAB_00159c95;
    }
    break;
  case 0x200009:
switchD_0015923b_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      ImStb::stb_textedit_clamp(this,state);
      iVar12 = (this->Stb).cursor;
      if (0 < iVar12) {
        ImStb::stb_textedit_delete(this,state,iVar12 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_00159c95;
    }
    break;
  case 0x20000a:
    lVar17 = (long)(this->Stb).undostate.undo_point;
    if (lVar17 != 0) {
      iVar12 = (this->Stb).undostate.undo_rec[lVar17 + -1].where;
      iVar20 = (this->Stb).undostate.undo_rec[lVar17 + -1].insert_length;
      uVar25 = (this->Stb).undostate.undo_rec[lVar17 + -1].delete_length;
      iVar23 = (this->Stb).undostate.undo_rec[lVar17 + -1].char_storage;
      uVar14 = (ulong)(this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_rec[uVar14 - 1].char_storage = -1;
      (this->Stb).undostate.undo_rec[uVar14 - 1].insert_length = uVar25;
      (this->Stb).undostate.undo_rec[uVar14 - 1].delete_length = iVar20;
      (this->Stb).undostate.undo_rec[uVar14 - 1].where = iVar12;
      if ((long)(int)uVar25 != 0) {
        iVar26 = (this->Stb).undostate.undo_char_point;
        if ((int)(iVar26 + uVar25) < 999) {
          do {
            iVar24 = (this->Stb).undostate.redo_char_point;
            do {
              sVar15 = (short)uVar14;
              lVar17 = (long)sVar15;
              if ((int)(iVar26 + uVar25) <= iVar24) {
                (this->Stb).undostate.undo_rec[lVar17 + -1].char_storage = iVar24 - uVar25;
                uVar14 = 0;
                uVar19 = 0;
                if (0 < (int)uVar25) {
                  uVar19 = (ulong)uVar25;
                }
                (this->Stb).undostate.redo_char_point = iVar24 - uVar25;
                puVar8 = (this->TextW).Data;
                for (; uVar19 != uVar14; uVar14 = uVar14 + 1) {
                  *(unsigned_short *)
                   ((long)this + uVar14 * 2 + (long)iVar24 * 2 + (long)(int)uVar25 * -2 + 0x69c) =
                       puVar8[(long)iVar12 + uVar14];
                }
                goto LAB_0015984d;
              }
              if (sVar15 == 99) goto LAB_00159c95;
            } while (0x62 < sVar15);
            if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
              iVar26 = (this->Stb).undostate.undo_rec[0x62].insert_length;
              iVar24 = iVar24 + iVar26;
              (this->Stb).undostate.redo_char_point = iVar24;
              __dest = (this->Stb).undostate.undo_char + iVar24;
              memmove(__dest,__dest + -(long)iVar26,(long)(999 - iVar24) * 2);
              lVar17 = (long)(this->Stb).undostate.redo_point;
              piVar18 = &(this->Stb).undostate.undo_rec[lVar17].char_storage;
              for (lVar21 = lVar17; lVar21 < 0x62; lVar21 = lVar21 + 1) {
                if (-1 < *piVar18) {
                  *piVar18 = *piVar18 + iVar26;
                }
                piVar18 = piVar18 + 4;
              }
            }
            memmove((this->Stb).undostate.undo_rec + lVar17 + 1,
                    (this->Stb).undostate.undo_rec + lVar17,lVar17 * -0x10 + 0x620);
            iVar26 = (this->Stb).undostate.undo_char_point;
            uVar22 = *(int *)&(this->Stb).undostate.redo_point + 1;
            uVar14 = (ulong)uVar22;
            (this->Stb).undostate.redo_point = (short)uVar22;
          } while( true );
        }
        (this->Stb).undostate.undo_rec[uVar14 - 1].insert_length = 0;
LAB_0015984d:
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar12,uVar25);
      }
      if (iVar20 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar12,(this->Stb).undostate.undo_char + iVar23,iVar20)
        ;
        piVar18 = &(this->Stb).undostate.undo_char_point;
        *piVar18 = *piVar18 - iVar20;
      }
      (this->Stb).cursor = iVar20 + iVar12;
      uVar3 = (this->Stb).undostate.undo_point;
      uVar6 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar3 + -1;
      (this->Stb).undostate.redo_point = uVar6 + -1;
    }
    goto LAB_00159c95;
  case 0x20000b:
    lVar17 = (long)(this->Stb).undostate.redo_point;
    if (lVar17 != 99) {
      sVar15 = (this->Stb).undostate.undo_point;
      iVar12 = (this->Stb).undostate.undo_rec[lVar17].where;
      iVar20 = (this->Stb).undostate.undo_rec[lVar17].insert_length;
      uVar25 = (this->Stb).undostate.undo_rec[lVar17].delete_length;
      iVar23 = (this->Stb).undostate.undo_rec[lVar17].char_storage;
      (this->Stb).undostate.undo_rec[sVar15].delete_length = iVar20;
      (this->Stb).undostate.undo_rec[sVar15].insert_length = uVar25;
      (this->Stb).undostate.undo_rec[sVar15].where = iVar12;
      (this->Stb).undostate.undo_rec[sVar15].char_storage = -1;
      if (uVar25 != 0) {
        iVar26 = (this->Stb).undostate.undo_char_point;
        if ((this->Stb).undostate.redo_char_point < (int)(iVar26 + uVar25)) {
          pSVar10 = (this->Stb).undostate.undo_rec + sVar15;
          pSVar10->insert_length = 0;
          pSVar10->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar15].char_storage = iVar26;
          (this->Stb).undostate.undo_char_point = iVar26 + uVar25;
          uVar14 = 0;
          uVar19 = 0;
          if (0 < (int)uVar25) {
            uVar19 = (ulong)uVar25;
          }
          puVar8 = (this->TextW).Data;
          for (; uVar19 != uVar14; uVar14 = uVar14 + 1) {
            (this->Stb).undostate.undo_char[(long)iVar26 + uVar14] = puVar8[(long)iVar12 + uVar14];
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar12,uVar25);
      }
      if (iVar20 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar12,(this->Stb).undostate.undo_char + iVar23,iVar20)
        ;
        piVar18 = &(this->Stb).undostate.redo_char_point;
        *piVar18 = *piVar18 + iVar20;
      }
      (this->Stb).cursor = iVar20 + iVar12;
      uVar4 = (this->Stb).undostate.undo_point;
      uVar7 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar4 + 1;
      (this->Stb).undostate.redo_point = uVar7 + 1;
    }
    goto LAB_00159c95;
  case 0x20000c:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar12 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_001599a9;
    }
    ImStb::stb_textedit_move_to_first(state);
    goto LAB_00159c9a;
  case 0x20000d:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar12 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_001599a9:
      (this->Stb).cursor = iVar12;
LAB_001599ad:
      ImStb::stb_textedit_clamp(this,state);
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    goto LAB_00159c9a;
  default:
    switch(key) {
    case 0x600000:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar12 = (this->Stb).select_end;
      if (0 < iVar12) {
        iVar12 = iVar12 + -1;
        goto LAB_00159714;
      }
      break;
    case 0x600001:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      piVar18 = &(this->Stb).select_end;
      *piVar18 = *piVar18 + 1;
      ImStb::stb_textedit_clamp(this,state);
      iVar12 = (this->Stb).select_end;
      break;
    case 0x600002:
    case 0x60000e:
      goto switchD_0015923b_caseD_200002;
    case 0x600003:
    case 0x60000f:
      goto switchD_0015923b_caseD_200003;
    case 0x600004:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        uVar22 = (this->Stb).cursor;
        puVar8 = (this->TextW).Data;
        uVar13 = (int)uVar22 >> 0x1f & uVar22;
        while ((uVar25 = uVar13, 0 < (int)uVar22 && (uVar25 = uVar22, puVar8[uVar22 - 1] != 10))) {
          uVar22 = uVar22 - 1;
          state->cursor = uVar22;
        }
      }
      else {
        state->cursor = 0;
        uVar25 = 0;
      }
      (this->Stb).select_end = uVar25;
      goto LAB_00159c95;
    case 0x600005:
      iVar12 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        lVar21 = (long)iVar12;
        iVar20 = (this->Stb).cursor;
        lVar17 = (long)iVar20;
        puVar8 = (this->TextW).Data;
        if (lVar21 < lVar17) {
          iVar12 = iVar20;
        }
        goto LAB_00159ab0;
      }
      state->cursor = iVar12;
      goto LAB_00159c89;
    case 0x600006:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      (this->Stb).select_end = 0;
      (this->Stb).cursor = 0;
      goto LAB_00159c95;
    case 0x600007:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar12 = this->CurLenW;
LAB_00159714:
      (this->Stb).select_end = iVar12;
      break;
    case 0x600008:
      goto switchD_0015923b_caseD_200008;
    case 0x600009:
      goto switchD_0015923b_caseD_200009;
    default:
      uVar25 = 0;
      if (key < 0x200000) {
        uVar25 = key;
      }
      if ((int)uVar25 < 1) goto LAB_00159c9a;
      _ch = (float)CONCAT22(uStack_46,(short)uVar25);
      if (uVar25 == 10 && uVar2 != '\0') goto LAB_00159c9a;
      if ((((this->Stb).insert_mode == '\0') || ((this->Stb).select_start != (this->Stb).select_end)
          ) || (iVar12 = (this->Stb).cursor, this->CurLenW <= iVar12)) {
        ImStb::stb_textedit_delete_selection(this,state);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,&ch,1);
        if (!bVar11) goto LAB_00159c9a;
        ImStb::stb_text_makeundo_insert(state,state->cursor,1);
      }
      else {
        ImStb::stb_text_makeundo_replace(this,state,iVar12,1,1);
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,&ch,1);
        if (!bVar11) goto LAB_00159c9a;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_00159c95;
    case 0x60000c:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar12 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_001596a8;
    case 0x60000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar12 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_001596a8:
      (this->Stb).cursor = iVar12;
      (this->Stb).select_end = iVar12;
      goto LAB_001599ad;
    }
    (this->Stb).cursor = iVar12;
    goto LAB_00159c95;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_00159c95;
LAB_00159ab0:
  iVar20 = iVar20 + 1;
  if (lVar21 <= lVar17) goto LAB_00159c89;
  if (puVar8[lVar17] == 10) {
    iVar12 = (int)lVar17;
    goto LAB_00159c89;
  }
  lVar17 = lVar17 + 1;
  state->cursor = iVar20;
  goto LAB_00159ab0;
LAB_00159c89:
  (this->Stb).select_end = iVar12;
  goto LAB_00159c95;
LAB_0015949d:
  if (iVar20 == iVar12) goto LAB_00159c9a;
  fVar1 = _ch;
  if ((this->Stb).has_preferred_x != '\0') {
    fVar1 = (this->Stb).preferred_x;
  }
  if ((local_38 == 0) ||
     (uVar22 = local_3c + local_38, (this->TextW).Data[(long)(int)uVar22 + -1] != 10))
  goto LAB_00159c9a;
  (this->Stb).cursor = uVar22;
  ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,uVar22);
  iVar23 = row.num_chars;
  iVar24 = 0;
  iVar26 = 0;
  if (0 < row.num_chars) {
    iVar26 = row.num_chars;
  }
  iVar5 = (this->Stb).cursor;
  fVar9 = row.x0;
  for (; iVar26 != iVar24; iVar24 = iVar24 + 1) {
    fVar27 = ImStb::STB_TEXTEDIT_GETWIDTH(this,uVar22,iVar24);
    if (((fVar27 == -1.0) && (!NAN(fVar27))) || (fVar9 = fVar9 + fVar27, fVar1 < fVar9)) break;
    state->cursor = iVar5 + 1 + iVar24;
  }
  ImStb::stb_textedit_clamp(this,state);
  (this->Stb).has_preferred_x = '\x01';
  (this->Stb).preferred_x = fVar1;
  if (uVar25 != 0) {
    (this->Stb).select_end = (this->Stb).cursor;
  }
  iVar20 = iVar20 + 1;
  local_3c = uVar22;
  local_38 = iVar23;
  goto LAB_0015949d;
LAB_00159337:
  uVar22 = local_34;
  if (iVar20 == iVar12) goto LAB_00159c9a;
  fVar1 = _ch;
  if ((this->Stb).has_preferred_x != '\0') {
    fVar1 = (this->Stb).preferred_x;
  }
  if (uVar22 == local_3c) goto LAB_00159c9a;
  (this->Stb).cursor = uVar22;
  ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,uVar22);
  iVar26 = 0;
  iVar23 = row.num_chars;
  if (row.num_chars < 1) {
    iVar23 = 0;
  }
  iVar24 = (this->Stb).cursor;
  fVar9 = row.x0;
  for (; iVar23 != iVar26; iVar26 = iVar26 + 1) {
    fVar27 = ImStb::STB_TEXTEDIT_GETWIDTH(this,uVar22,iVar26);
    if (((fVar27 == -1.0) && (!NAN(fVar27))) || (fVar9 = fVar9 + fVar27, fVar1 < fVar9)) break;
    state->cursor = iVar24 + 1 + iVar26;
  }
  ImStb::stb_textedit_clamp(this,state);
  (this->Stb).has_preferred_x = '\x01';
  (this->Stb).preferred_x = fVar1;
  if (uVar25 != 0) {
    (this->Stb).select_end = (this->Stb).cursor;
  }
  uVar14 = (ulong)(uVar22 - 1);
  if ((int)uVar22 < 1) {
    uVar14 = 0;
  }
  uVar13 = (uint)uVar14;
  uVar16 = uVar13 + 1;
  do {
    local_34 = (int)uVar13 >> 0x1f & uVar13;
    if ((int)uVar14 < 1) break;
    uVar16 = uVar16 - 1;
    lVar17 = uVar14 - 1;
    uVar14 = uVar14 - 1;
    local_34 = uVar16;
  } while ((this->TextW).Data[lVar17] != 10);
  iVar20 = iVar20 + 1;
  local_3c = uVar22;
  goto LAB_00159337;
switchD_0015923b_caseD_200000:
  if ((this->Stb).select_start == (this->Stb).select_end) {
    if (0 < state->cursor) {
      state->cursor = state->cursor + -1;
    }
  }
  else {
    ImStb::stb_textedit_move_to_first(state);
  }
LAB_00159c95:
  (this->Stb).has_preferred_x = '\0';
LAB_00159c9a:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}